

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::duel_cmd(int cid,char **args,int argc)

{
  char *__s1;
  char *s;
  bool bVar1;
  int iVar2;
  clientinfo *ci;
  char **ppcVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  string f;
  stringformatter local_140;
  char local_138 [264];
  
  __s1 = args[1];
  s = args[2];
  bVar1 = QServ::getlastSA(&qs);
  if ((((bVar1) && (args[1] != (char *)0x0)) && (args[2] != (char *)0x0)) &&
     ((*s != '\0' && (*__s1 != '\0')))) {
    uVar5 = (ulong)mcduel;
    if (-1 < (int)mcduel) {
      ppcVar3 = qserv_modenames;
      lVar6 = 0;
      do {
        iVar2 = strcmp(__s1,*ppcVar3);
        if (iVar2 == 0) {
          changemap(s,(int)lVar6);
          bVar1 = QServ::getlastSA(&qs);
          if (!bVar1) {
            return;
          }
          iVar2 = QServ::getSender(&qs);
          ci = QServ::getClient(&qs,iVar2);
          persist = 1;
          pausegame(true,ci);
          iVar2 = dueltimermillis;
          if (dueltimermillis == 0) goto LAB_001580bb;
          goto LAB_00158061;
        }
        lVar6 = lVar6 + 1;
        ppcVar3 = ppcVar3 + 1;
      } while (uVar5 + 1 != lVar6);
    }
    QServ::getlastSA(&qs);
    iVar2 = QServ::getSender(&qs);
    sendf(iVar2,1,"ris",0x23,"\f3Error: Unknown mode");
    return;
  }
  local_140.buf = local_138;
  stringformatter::operator()(&local_140,"\f3Error: Invalid mode/mapname provided");
  iVar2 = QServ::getSender(&qs);
  goto LAB_00157fe1;
  while (iVar2 = iVar4, iVar4 <= dueltimermillis) {
LAB_00158061:
    iVar4 = iVar2 + -1;
    out(3,"\f2Get ready! Starting duel in %d:%d",(ulong)(uint)((iVar2 / 1000) % 1000));
    if (iVar4 == 0) break;
  }
LAB_001580bb:
  pausegame(false,ci);
  local_140.buf = local_138;
  stringformatter::operator()
            (&local_140,"\f2Duel has started: %s on map %s. Good luck, have fun.",*ppcVar3,s);
  iVar2 = -1;
LAB_00157fe1:
  sendf(iVar2,1,"ris",0x23,local_138);
  return;
}

Assistant:

QSERV_CALLBACK duel_cmd(p) {
        const char *mapname = args[2];
        char *mn = args[1];
        if(CMD_SA && args[1] != NULL && args[2] != NULL && *mapname !=NULL && *mn!=NULL) {
            int gm; // default set to current mode td
            bool valid = false;
            
            // intialize this for perf
            for(int i = 0; i <= mcduel; i++)  {
                if(!strcmp(mn, qserv_modenames[i]))  {
                    gm = i;
                    // use other list to send full name of mode
                    changemap(mapname, gm);
                    valid = true;
                    break;
                }
            }
            if(CMD_SA && valid) {
                clientinfo *ci = qs.getClient(CMD_SENDER);
                server::persist = true;
                pausegame(true,ci);
                int dueltimer;
                for(dueltimer = dueltimermillis; dueltimer <= dueltimermillis && dueltimer != (0); --dueltimer) {
                    out(ECHO_SERV, "\f2Get ready! Starting duel in %d:%d",(dueltimer/1000) % 1000,dueltimer);
                }
                pausegame(false,ci);
                defformatstring(f)("\f2Duel has started: %s on map %s. Good luck, have fun.", qserv_modenames[gm], mapname);
                sendf(-1, 1, "ris", N_SERVMSG, f);
            }
            
            if(!valid) {sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Unknown mode");}
        }
        else {
            bool valid = false;
            defformatstring(f)("\f3Error: Invalid mode/mapname provided");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, f);
        }
    }